

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

size_t __thiscall asmjit::CodeHolder::codeSize(CodeHolder *this)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  Value VVar5;
  void *pvVar6;
  CodeHolder *pCVar7;
  Slot *pSVar8;
  Slot *pSVar9;
  undefined1 uVar10;
  Error EVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  undefined4 extraout_var;
  byte bVar15;
  byte bVar16;
  AddressTableEntry *pAVar17;
  long lVar18;
  CodeBuffer *out;
  uint64_t *extraout_RDX;
  uint64_t *extraout_RDX_00;
  uint64_t *out_00;
  Value unaff_RBX;
  ulong unaff_RBP;
  Value VVar19;
  Value VVar20;
  CodeHolder *pCVar21;
  uint uVar22;
  long lVar23;
  CodeHolder *pCVar24;
  Value unaff_R12;
  Value unaff_R13;
  undefined8 unaff_R14;
  undefined7 uVar25;
  CodeHolder *unaff_R15;
  bool bVar26;
  bool bVar27;
  Value VStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  Expression *pEStack_c8;
  Value VStack_c0;
  Value VStack_b8;
  char cStack_b0;
  undefined7 uStack_af;
  ulong uStack_a8;
  CodeHolder *pCStack_a0;
  code *pcStack_98;
  byte bStack_81;
  Value VStack_80;
  CodeHolder *pCStack_78;
  Value VStack_70;
  Value VStack_68;
  Value VStack_60;
  CodeHolder *pCStack_58;
  long lStack_50;
  ulong uStack_48;
  uint8_t *puStack_40;
  
  uVar12 = (ulong)(this->_sectionsByOrder).super_ZoneVectorBase._size;
  if (uVar12 == 0) {
    sVar13 = 0;
  }
  else {
    lVar18 = 0;
    pCVar21 = (CodeHolder *)0x0;
    VVar19.constant = 0;
    do {
      lVar23 = *(long *)((long)(this->_sectionsByOrder).super_ZoneVectorBase._data + lVar18);
      uVar14 = *(ulong *)(lVar23 + 0x50);
      if (*(ulong *)(lVar23 + 0x50) < *(ulong *)(lVar23 + 0x18)) {
        uVar14 = *(ulong *)(lVar23 + 0x18);
      }
      if (uVar14 != 0) {
        pCVar24 = (CodeHolder *)
                  (-(ulong)*(uint *)(lVar23 + 8) &
                  (long)(pCVar21->_allocator)._slots + ((ulong)*(uint *)(lVar23 + 8) - 0x49));
        if (pCVar24 < pCVar21) {
          codeSize();
          if ((CodeBuffer *)VVar19.constant == (CodeBuffer *)0xffffffffffffffff) {
            return 2;
          }
          pCVar21->_baseAddress = (uint64_t)VVar19;
          bVar15 = (pCVar21->_environment)._arch;
          uVar12 = CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar15);
          VVar5 = (Value)pCVar21->_addressTableSection;
          VStack_80.constant = 0;
          VVar20 = VVar19;
          pCVar24 = pCVar21;
          if ((Section *)VVar5.constant == (Section *)0x0) {
            lVar18 = 0;
          }
          else {
            unaff_R13.expression = (Expression *)(VVar5.constant + 0x48);
            if ((*(size_t *)(VVar5.constant + 0x58) < (VVar5.label)->_offset) &&
               (VStack_80.constant = 9, (*(byte *)(VVar5.constant + 0x60) & 2) == 0)) {
              pcStack_98 = (code *)0x115b51;
              VVar20.expression = unaff_R13.expression;
              VStack_80._0_4_ =
                   CodeHolder_reserveInternal
                             (pCVar21,(CodeBuffer *)unaff_R13.expression,(VVar5.label)->_offset);
              VStack_80.constant._4_4_ = extraout_var;
              unaff_RBX = VVar5;
              unaff_R12 = VVar19;
              unaff_R15 = pCVar21;
            }
            if ((int)VStack_80.constant != 0) {
              return VStack_80.constant;
            }
            lVar18._0_1_ = *(uint8_t *)unaff_R13;
            lVar18._1_1_ = ((uint8_t *)((long)unaff_R13 + 1))[0];
            lVar18._2_1_ = ((uint8_t *)((long)unaff_R13 + 1))[1];
            lVar18._3_1_ = ((uint8_t *)((long)unaff_R13 + 3))[0];
            lVar18._4_1_ = ((uint8_t *)((long)unaff_R13 + 3))[1];
            lVar18._5_1_ = ((uint8_t *)((long)unaff_R13 + 3))[2];
            lVar18._6_1_ = ((uint8_t *)((long)unaff_R13 + 3))[3];
            lVar18._7_1_ = ((uint8_t *)((long)unaff_R13 + 3))[4];
          }
          uVar14 = (ulong)(pCVar21->_relocations).super_ZoneVectorBase._size;
          bVar26 = uVar14 == 0;
          if (bVar26) {
            VStack_68.constant = 0;
            goto LAB_00115aed;
          }
          unaff_RBX = (Value)(pCVar21->_relocations).super_ZoneVectorBase._data;
          puStack_40 = (unaff_RBX.expression)->valueType + uVar14 * 8 + -1;
          uStack_48 = (ulong)(bVar15 & 1) ^ 3;
          VStack_68.constant = 0;
          bStack_81 = bVar15;
          VStack_60 = VVar19;
          pCStack_58 = pCVar21;
          lStack_50 = lVar18;
          goto LAB_001157e2;
        }
        pCVar21 = (CodeHolder *)((long)(pCVar24->_allocator)._slots + (uVar14 - 0x48));
        VVar19._0_1_ = (byte)VVar19.constant | CARRY8((ulong)pCVar24,uVar14);
        VVar19.constant._1_7_ = 0;
      }
      lVar18 = lVar18 + 8;
    } while (uVar12 << 3 != lVar18);
    sVar13 = -(ulong)((char)VVar19.constant != '\0') | (ulong)pCVar21;
  }
  return sVar13;
  while( true ) {
    unaff_RBX.expression = (Expression *)(unaff_RBX.expression)->value;
    bVar26 = (uint8_t *)unaff_RBX.constant == puStack_40;
    if (bVar26) break;
LAB_001157e2:
    unaff_R12.constant = *unaff_RBX.constant;
    iVar2 = *(int *)((unaff_R12.expression)->reserved + 1);
    if (iVar2 == 0) {
      unaff_R15 = (CodeHolder *)0x5;
      goto LAB_00115ac4;
    }
    uVar22 = (pCVar21->_sections).super_ZoneVectorBase._size;
    if (uVar22 <= *(uint *)((unaff_R12.expression)->value + 1)) {
      pcStack_98 = (code *)0x115b64;
      relocateToBase();
LAB_00115b64:
      pcStack_98 = (code *)0x115b69;
      relocateToBase();
      return 2;
    }
    pvVar6 = (pCVar21->_sections).super_ZoneVectorBase._data;
    lVar18 = *(long *)((long)pvVar6 + (ulong)*(uint *)((unaff_R12.expression)->value + 1) * 8);
    uVar3 = (unaff_R12.label)->_parentId;
    if ((ulong)uVar3 == 0xffffffff) {
      lVar23 = 0;
    }
    else {
      if (uVar22 <= uVar3) goto LAB_00115b64;
      lVar23 = *(long *)((long)pvVar6 + (ulong)uVar3 * 8);
    }
    pCVar24 = (CodeHolder *)(unaff_R12.label)->_section;
    uVar14 = (unaff_R12.label)->_offset;
    unaff_R15 = (CodeHolder *)0x1;
    VVar20.expression = (Expression *)(*(ulong *)(lVar18 + 0x50) - uVar14);
    pCStack_78 = pCVar24;
    if (((*(ulong *)(lVar18 + 0x50) < uVar14 || (CodeBuffer *)VVar20.constant == (CodeBuffer *)0x0)
        || (out = (CodeBuffer *)(ulong)*(byte *)((long)(unaff_R12.expression)->value + 2),
           VVar20.constant < out)) || (4 < iVar2 - 1U)) {
switchD_00115a79_caseD_3:
      VStack_80.constant = 0x18;
    }
    else {
      VVar20 = (Value)((Value *)(lVar18 + 0x10))->expression;
      VStack_70 = (Value)((Value *)(lVar18 + 0x48))->expression;
      unaff_RBP = *(byte *)((long)(unaff_R12.expression)->value + 4) + uVar14;
      switch(iVar2) {
      case 1:
        pcStack_98 = (code *)0x1158a7;
        EVar11 = CodeHolder_evaluateExpression(pCVar24,(Expression *)&pCStack_78,(uint64_t *)out);
        bVar27 = EVar11 == 0;
        VVar20.constant = VStack_80.constant & 0xffffffff;
        if (!bVar27) {
          VVar20.constant._4_4_ = 0;
          VVar20.constant._0_4_ = EVar11;
        }
        uVar25 = (undefined7)((ulong)VVar5 >> 8);
        pCVar21 = pCStack_58;
        VStack_80 = VVar20;
        if (bVar27) {
          uVar12 = CONCAT71(uVar25,bStack_81);
          break;
        }
        unaff_R15 = (CodeHolder *)(ulong)((uint)bVar27 * 5 + 1);
        uVar12 = CONCAT71(uVar25,bStack_81);
        goto LAB_00115ac4;
      case 3:
        if (lVar23 == 0) goto switchD_00115a79_caseD_3;
        pCVar24 = (CodeHolder *)
                  ((long)(pCVar24->_allocator)._slots +
                  (long)(VStack_60.expression[-3].valueType + *(long *)(lVar23 + 0x10) + -1));
        pCStack_78 = pCVar24;
        break;
      case 4:
        VVar20.expression =
             (Expression *)((VVar20.expression)->valueType + (long)(VStack_60.constant - 1));
        pCStack_78 = (CodeHolder *)
                     ((long)pCVar24 -
                     (long)((VVar20.expression)->valueType + (long)out + (uVar14 - 1)));
        pCVar24 = pCStack_78;
        if (((uVar12 & 1) == 0) &&
           (pCVar24 = (CodeHolder *)((ulong)&pCStack_78[0x6bca1a]._addressTableSection >> 0x20),
           pCVar24 != (CodeHolder *)0x0)) {
          VStack_80.constant = 0x19;
          goto LAB_00115ac4;
        }
        break;
      case 5:
        if ((unaff_RBP < 2) || (*(char *)((long)(unaff_R12.expression)->value + 3) != '\x04'))
        goto switchD_00115a79_caseD_3;
        pCStack_78 = (CodeHolder *)
                     ((long)pCVar24 -
                     (long)((VStack_60.expression)->valueType + (long)(VVar20.constant - 1) +
                           (long)&out->_data + uVar14));
        if ((CodeHolder *)(long)(int)pCStack_78 != pCStack_78) {
          for (pAVar17 = (pCVar21->_addressTableEntries)._root; pAVar17 != (AddressTableEntry *)0x0;
              pAVar17 = (AddressTableEntry *)
                        ((pAVar17->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                         super_ZoneTreeNode._rbNodeData[uVar22 >> 0x1f] & 0xfffffffffffffffe)) {
            pCVar7 = (CodeHolder *)pAVar17->_address;
            uVar22 = (uint)(pCVar7 >= pCVar24 && pCVar7 != pCVar24) - (uint)(pCVar7 < pCVar24);
            if (uVar22 == 0) goto LAB_001159b7;
          }
          pAVar17 = (AddressTableEntry *)0x0;
LAB_001159b7:
          if (pAVar17 == (AddressTableEntry *)0x0) {
LAB_00115a2c:
            bVar27 = false;
            VStack_80.constant = 0x18;
          }
          else {
            if ((Section *)VVar5.constant == (Section *)0x0) goto LAB_00115b75;
            if (pAVar17->_slot == 0xffffffff) {
              pAVar17->_slot = (uint32_t)VStack_68.constant;
              VStack_68._0_4_ = (uint32_t)VStack_68.constant + 1;
              VStack_68.constant._4_4_ = 0;
            }
            pCVar24 = (CodeHolder *)((ulong)pAVar17->_slot << ((byte)uStack_48 & 0x3f));
            pCStack_78 = (CodeHolder *)
                         (((long)(VVar5.expression)->value[1].expression -
                          (long)((VVar20.expression)->valueType + (uVar14 - 1) + (long)out)) +
                         (long)pCVar24);
            if ((CodeHolder *)(long)(int)pCStack_78 == pCStack_78) {
              cVar1 = *(char *)((VStack_70.constant - 1) + unaff_RBP);
              if (cVar1 == -0x18) {
                uVar10 = 0x15;
              }
              else {
                if (cVar1 != -0x17) goto LAB_00115a2c;
                uVar10 = 0x25;
              }
              *(undefined1 *)((VStack_70.constant - 2) + unaff_RBP) = 0xff;
              *(undefined1 *)((VStack_70.constant - 1) + unaff_RBP) = uVar10;
              *(Section **)((long)(pCVar24->_allocator)._slots + lStack_50 + -0x48) =
                   (unaff_R12.label)->_section;
              bVar27 = true;
            }
            else {
              VStack_80.constant = 0x19;
              bVar27 = false;
            }
          }
          if (!bVar27) goto LAB_00115ac4;
        }
      }
      pCVar7 = pCStack_78;
      switch(*(undefined1 *)((long)(unaff_R12.expression)->value + 3)) {
      case 1:
        (VStack_70.expression)->valueType[unaff_RBP - 1] = (uint8_t)pCStack_78;
        break;
      case 2:
        ((VStack_70.expression)->valueType + (unaff_RBP - 1))[0] = (uint8_t)pCStack_78;
        ((VStack_70.expression)->valueType + (unaff_RBP - 1))[1] = pCStack_78._1_1_;
        break;
      default:
        goto switchD_00115a79_caseD_3;
      case 4:
        *(undefined4 *)((VStack_70.expression)->valueType + (unaff_RBP - 1)) = pCStack_78._0_4_;
        break;
      case 8:
        *(CodeHolder **)((VStack_70.expression)->valueType + (unaff_RBP - 1)) = pCStack_78;
      }
      unaff_R15 = (CodeHolder *)0x0;
      pCStack_78 = pCVar7;
    }
LAB_00115ac4:
    if (((int)unaff_R15 != 5) && ((int)unaff_R15 != 0)) break;
  }
LAB_00115aed:
  if (bVar26 == false) {
    return VStack_80.constant;
  }
  sVar4 = (pCVar21->_sectionsByOrder).super_ZoneVectorBase._size;
  if (sVar4 != 0) {
    if (*(Section **)
         ((long)(pCVar21->_sectionsByOrder).super_ZoneVectorBase._data + (ulong)(sVar4 - 1) * 8) ==
        (Section *)VVar5.constant) {
      uVar12 = (ulong)(uint)((int)VStack_68.constant << ((byte)uVar12 & 1 ^ 3));
      *(ulong *)(VVar5.constant + 0x50) = uVar12;
      (VVar5.label)->_offset = uVar12;
      return 0;
    }
    return 0;
  }
  pcStack_98 = (code *)0x115b75;
  relocateToBase();
LAB_00115b75:
  pcStack_98 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar18 = 1;
  bVar27 = false;
  out_00 = extraout_RDX;
  VStack_e0 = VVar20;
  VStack_c0 = unaff_RBX;
  VStack_b8 = unaff_R12;
  uStack_a8 = uVar12;
  pCStack_a0 = unaff_R15;
  pcStack_98 = (code *)unaff_RBP;
  cStack_b0 = bVar26;
  uStack_af = (int7)((ulong)unaff_R13 >> 8);
  do {
    switch(*(undefined1 *)((long)(pCVar24->_allocator)._slots + lVar18 + -0x48)) {
    case 0:
      pEStack_c8 = (Expression *)0x0;
      break;
    case 1:
      pEStack_c8 = (Expression *)(pCVar24->_allocator)._slots[lVar18 + -9];
      break;
    case 2:
      pSVar8 = (pCVar24->_allocator)._slots[lVar18 + -9];
      pSVar9 = pSVar8[4].next;
      if (pSVar9 != (Slot *)0x0) {
        pEStack_c8 = (Expression *)((long)&(pSVar9[2].next)->next + (long)&(pSVar8[3].next)->next);
        break;
      }
      unaff_RBP = 0x43;
LAB_00115c21:
      bVar26 = false;
      goto LAB_00115c23;
    case 3:
      EVar11 = CodeHolder_evaluateExpression
                         ((CodeHolder *)(pCVar24->_allocator)._slots[lVar18 + -9],
                          (Expression *)&pEStack_c8,out_00);
      unaff_RBP = unaff_RBP & 0xffffffff;
      out_00 = extraout_RDX_00;
      if (EVar11 != 0) {
        unaff_RBP = (ulong)EVar11;
        goto LAB_00115c21;
      }
      break;
    default:
      bVar26 = false;
      unaff_RBP = 3;
      goto LAB_00115c23;
    }
    (&VStack_e0)[lVar18].expression = pEStack_c8;
    bVar26 = true;
LAB_00115c23:
    if (!bVar26) break;
    lVar18 = lVar18 + 1;
    bVar27 = lVar18 != 2;
  } while (lVar18 == 2);
  if (!bVar27) goto LAB_00115cd1;
  bVar15 = (byte)uStack_d0;
  switch((pCVar24->_environment)._arch) {
  case '\0':
    uVar12 = uStack_d0 + uStack_d8;
    break;
  case '\x01':
    uVar12 = uStack_d8 - uStack_d0;
    break;
  case '\x02':
    uVar12 = uStack_d0 * uStack_d8;
    break;
  case '\x03':
    uStack_d8 = uStack_d8 << (bVar15 & 0x3f);
    goto LAB_00115c95;
  case '\x04':
    uStack_d8 = uStack_d8 >> (bVar15 & 0x3f);
LAB_00115c95:
    uVar12 = 0;
    if (uStack_d0 < 0x40) {
      uVar12 = uStack_d8;
    }
    break;
  case '\x05':
    bVar16 = 0x3f;
    if (uStack_d0 < 0x3f) {
      bVar16 = bVar15;
    }
    uVar12 = (long)uStack_d8 >> (bVar16 & 0x3f);
    break;
  default:
    unaff_RBP = 3;
    goto LAB_00115cd1;
  }
  (VStack_e0.expression)->opType = (char)uVar12;
  (VStack_e0.expression)->valueType[0] = (char)(uVar12 >> 8);
  (VStack_e0.expression)->valueType[1] = (char)(uVar12 >> 0x10);
  (VStack_e0.expression)->reserved[0] = (char)(uVar12 >> 0x18);
  (VStack_e0.expression)->reserved[1] = (char)(uVar12 >> 0x20);
  (VStack_e0.expression)->reserved[2] = (char)(uVar12 >> 0x28);
  (VStack_e0.expression)->reserved[3] = (char)(uVar12 >> 0x30);
  (VStack_e0.expression)->reserved[4] = (char)(uVar12 >> 0x38);
  unaff_RBP = 0;
LAB_00115cd1:
  return unaff_RBP & 0xffffffff;
}

Assistant:

size_t CodeHolder::codeSize() const noexcept {
  Support::FastUInt8 of = 0;
  uint64_t offset = 0;

  for (Section* section : _sectionsByOrder) {
    uint64_t realSize = section->realSize();

    if (realSize) {
      uint64_t alignedOffset = Support::alignUp(offset, section->alignment());
      ASMJIT_ASSERT(alignedOffset >= offset);
      offset = Support::addOverflow(alignedOffset, realSize, &of);
    }
  }

  if ((sizeof(uint64_t) > sizeof(size_t) && offset > SIZE_MAX) || of)
    return SIZE_MAX;

  return size_t(offset);
}